

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  domain_error *pdVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar5;
  allocator local_2c4;
  allocator local_2c3;
  allocator local_2c2;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  pair<const_char_*,_Catch::TagAlias> local_280;
  string local_230;
  SourceLineInfo local_210;
  TagAlias local_1e8;
  ostringstream oss;
  
  std::__cxx11::string::string((string *)&oss,alias,&local_2c1);
  std::__cxx11::string::string((string *)&local_280,"[@",&local_2c2);
  bVar1 = startsWith((string *)&oss,(string *)&local_280);
  bVar2 = true;
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_2c0,alias,&local_2c3);
    std::__cxx11::string::string((string *)&local_2a0,"]",&local_2c4);
    bVar2 = endsWith(&local_2c0,&local_2a0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    bVar2 = !bVar2;
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (!bVar2) {
    std::__cxx11::string::string((string *)&local_230,tag,(allocator *)&local_2c0);
    SourceLineInfo::SourceLineInfo(&local_210,lineInfo);
    TagAlias::TagAlias(&local_1e8,&local_230,&local_210);
    local_280.first = alias;
    TagAlias::TagAlias(&local_280.second,&local_1e8);
    std::pair<std::__cxx11::string_const,Catch::TagAlias>::pair<char_const*,Catch::TagAlias>
              ((pair<std::__cxx11::string_const,Catch::TagAlias> *)&oss,&local_280);
    pVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
            ::_M_insert_unique(&(this->m_registry)._M_t,(value_type *)&oss);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
             *)&oss);
    TagAlias::~TagAlias(&local_280.second);
    TagAlias::~TagAlias(&local_1e8);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"error: tag alias, \"");
    poVar3 = std::operator<<(poVar3,alias);
    poVar3 = std::operator<<(poVar3,"\" already registered.\n");
    poVar3 = std::operator<<(poVar3,"\tFirst seen at ");
    std::__cxx11::string::string((string *)&local_2c0,alias,(allocator *)&local_2a0);
    (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(&local_280,this,&local_2c0);
    operator<<(poVar3,(SourceLineInfo *)(local_280.first + 0x20));
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tRedefined at ");
    operator<<(poVar3,lineInfo);
    Option<Catch::TagAlias>::reset((Option<Catch::TagAlias> *)&local_280);
    std::__cxx11::string::_M_dispose();
    pdVar4 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string
              ((string *)&local_280,local_2c0._M_dataplus._M_p,(allocator *)&local_2a0);
    std::domain_error::domain_error(pdVar4,(string *)&local_280);
    __cxa_throw(pdVar4,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"error: tag alias, \"");
  poVar3 = std::operator<<(poVar3,alias);
  poVar3 = std::operator<<(poVar3,"\" is not of the form [@alias name].\n");
  operator<<(poVar3,lineInfo);
  pdVar4 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string
            ((string *)&local_280,local_2c0._M_dataplus._M_p,(allocator *)&local_2a0);
  std::domain_error::domain_error(pdVar4,(string *)&local_280);
  __cxa_throw(pdVar4,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }